

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

string * __thiscall
duckdb_re2::CEscape_abi_cxx11_(string *__return_storage_ptr__,duckdb_re2 *this,StringPiece *src)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  void *pvVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  
  lVar3 = *(long *)(this + 8);
  uVar1 = lVar3 * 4 + 1;
  pvVar4 = operator_new__(uVar1);
  if (lVar3 < 1) {
    uVar6 = 0;
  }
  else {
    pbVar5 = *(byte **)this;
    pbVar8 = pbVar5 + lVar3;
    uVar6 = 0;
    uVar7 = 0xffffffffffffffff;
    do {
      if (uVar1 - uVar6 < 2) goto LAB_011c72cb;
      bVar2 = *pbVar5;
      if (bVar2 < 0x22) {
        if (bVar2 == 9) {
          *(undefined2 *)((long)pvVar4 + uVar6) = 0x745c;
          goto LAB_011c7295;
        }
        if (bVar2 == 10) {
          *(undefined2 *)((long)pvVar4 + uVar6) = 0x6e5c;
          goto LAB_011c7295;
        }
        if (bVar2 == 0xd) {
          *(undefined2 *)((long)pvVar4 + uVar6) = 0x725c;
          goto LAB_011c7295;
        }
LAB_011c7259:
        if ((byte)(bVar2 + 0x81) < 0xa1) {
          if (uVar1 - uVar6 < 5) goto LAB_011c72cb;
          snprintf((char *)((long)pvVar4 + uVar6),5,"\\%03o");
          uVar6 = uVar6 + 4;
        }
        else {
          *(byte *)((long)pvVar4 + uVar6) = bVar2;
          uVar6 = uVar6 + 1;
        }
      }
      else {
        if (bVar2 == 0x22) {
          *(undefined2 *)((long)pvVar4 + uVar6) = 0x225c;
        }
        else if (bVar2 == 0x27) {
          *(undefined2 *)((long)pvVar4 + uVar6) = 0x275c;
        }
        else {
          if (bVar2 != 0x5c) goto LAB_011c7259;
          *(undefined2 *)((long)pvVar4 + uVar6) = 0x5c5c;
        }
LAB_011c7295:
        uVar6 = uVar6 + 2;
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 < pbVar8);
    if (uVar6 == uVar1) goto LAB_011c72cb;
  }
  *(undefined1 *)((long)pvVar4 + uVar6) = 0;
  uVar7 = uVar6;
LAB_011c72cb:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pvVar4,(long)pvVar4 + uVar7);
  operator_delete__(pvVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string CEscape(const StringPiece& src) {
  const size_t dest_len = src.size() * 4 + 1; // Maximum possible expansion
  char* dest = new char[dest_len];
  const size_t used = CEscapeString(src.data(), src.size(),
                                    dest, dest_len);
  std::string s = std::string(dest, used);
  delete[] dest;
  return s;
}